

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdManCheckNonDec_rec(If_DsdMan_t *p,int Id)

{
  uint uVar1;
  int iVar2;
  If_DsdObj_t *pObj;
  
  pObj = (If_DsdObj_t *)Vec_PtrEntry(&p->vObjs,Id);
  uVar1 = *(uint *)&pObj->field_0x4 & 7;
  iVar2 = 0;
  if (1 < uVar1 - 1) {
    if (uVar1 == 6) {
      iVar2 = 1;
    }
    else {
      uVar1 = 0;
      do {
        if (*(uint *)&pObj->field_0x4 >> 0x1b <= uVar1) {
          return 0;
        }
        iVar2 = If_DsdObjFaninLit(pObj,uVar1);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = Abc_Lit2Var(iVar2);
        iVar2 = If_DsdManCheckNonDec_rec(p,iVar2);
        uVar1 = uVar1 + 1;
      } while (iVar2 == 0);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int If_DsdManCheckNonDec_rec( If_DsdMan_t * p, int Id )
{
    If_DsdObj_t * pObj;
    int i, iFanin;
    pObj = If_DsdVecObj( &p->vObjs, Id );
    if ( If_DsdObjType(pObj) == IF_DSD_CONST0 )
        return 0;
    if ( If_DsdObjType(pObj) == IF_DSD_VAR )
        return 0;
    if ( If_DsdObjType(pObj) == IF_DSD_PRIME )
        return 1;
    If_DsdObjForEachFaninLit( &p->vObjs, pObj, iFanin, i )
        if ( If_DsdManCheckNonDec_rec( p, Abc_Lit2Var(iFanin) ) )
            return 1;
    return 0;
}